

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementGeneric.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementGeneric::EleIntLoadResidual_F
          (ChElementGeneric *this,ChVectorDynamic<> *R,double c)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  Scalar *pSVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ChVectorDynamic<> mFi;
  int local_68;
  undefined4 uStack_64;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  ulong local_58;
  Matrix<double,__1,_1,_0,__1,_1> local_50;
  Scalar local_40;
  double local_38;
  
  local_38 = c;
  local_68 = (*(this->super_ChElementBase)._vptr_ChElementBase[3])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_50,&local_68);
  (*(this->super_ChElementBase)._vptr_ChElementBase[10])(this,&local_50);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_50,&local_38);
  uVar7 = 0;
  local_58 = 0;
  while( true ) {
    iVar2 = (*(this->super_ChElementBase)._vptr_ChElementBase[2])(this);
    if (iVar2 <= (int)uVar7) break;
    uVar3 = (*(this->super_ChElementBase)._vptr_ChElementBase[4])(this,(ulong)uVar7);
    (*(this->super_ChElementBase)._vptr_ChElementBase[5])(&local_68,this,(ulong)uVar7);
    cVar1 = (**(code **)(*(long *)CONCAT44(uStack_64,local_68) + 0x18))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    if (cVar1 == '\0') {
      lVar5 = (long)(int)local_58;
      for (uVar6 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar6; uVar6 = uVar6 + 1) {
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_50,
                            lVar5 + uVar6);
        local_40 = *pSVar4;
        (*(this->super_ChElementBase)._vptr_ChElementBase[5])(&local_68,this,(ulong)uVar7);
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                            (ulong)(uint)(*(int *)((long)CONCAT44(uStack_64,local_68) +
                                                  *(long *)(*(long *)CONCAT44(uStack_64,local_68) +
                                                           -0x18) + 0xc) + (int)uVar6));
        *pSVar4 = local_40 + *pSVar4;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
      }
    }
    uVar7 = uVar7 + 1;
    local_58 = (ulong)((int)local_58 + uVar3);
  }
  Eigen::internal::handmade_aligned_free
            (local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void ChElementGeneric::EleIntLoadResidual_F(ChVectorDynamic<>& R, const double c) {
    ChVectorDynamic<> mFi(this->GetNdofs());
    this->ComputeInternalForces(mFi);
    // GetLog() << "EleIntLoadResidual_F , mFi=" << mFi << "  c=" << c << "\n";
    mFi *= c;

    //// RADU
    //// Attention: this is called from within a parallel OMP for loop.
    //// Must use atomic increment when updating the global vector R.

    int stride = 0;
    for (int in = 0; in < this->GetNnodes(); in++) {
        int nodedofs = GetNodeNdofs(in);
        // GetLog() << "  in=" << in << "  stride=" << stride << "  nodedofs=" << nodedofs << " offset=" <<
        // GetNodeN(in)->NodeGetOffset_w() << "\n";
        if (!GetNodeN(in)->GetFixed()) {
            for (int j = 0; j < nodedofs; j++)
#pragma omp atomic
                R(GetNodeN(in)->NodeGetOffset_w() + j) += mFi(stride + j);
        }
        stride += nodedofs;
    }
    // GetLog() << "EleIntLoadResidual_F , R=" << R << "\n";
}